

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O2

int ecp_mod_p255(mbedtls_mpi *N)

{
  int iVar1;
  ulong uVar2;
  mbedtls_mpi M;
  mbedtls_mpi local_60;
  mbedtls_mpi_uint Mp [6];
  
  iVar1 = 0;
  if (3 < N->n) {
    local_60.s = 1;
    uVar2 = N->n - 3;
    local_60.n = 5;
    if (uVar2 < 5) {
      local_60.n = uVar2;
    }
    local_60.p = Mp;
    Mp[0] = 0;
    Mp[1] = 0;
    Mp[2] = 0;
    Mp[3] = 0;
    Mp[4] = 0;
    Mp[5] = 0;
    memcpy(local_60.p,N->p + 3,(ulong)(uint)((int)local_60.n << 3));
    iVar1 = mbedtls_mpi_shift_r(&local_60,0x3f);
    if (iVar1 == 0) {
      local_60.n = local_60.n + 1;
      iVar1 = mbedtls_mpi_set_bit(N,0xff,'\0');
      if (iVar1 == 0) {
        for (uVar2 = 4; uVar2 < N->n; uVar2 = uVar2 + 1) {
          N->p[uVar2] = 0;
        }
        iVar1 = mbedtls_mpi_mul_int(&local_60,&local_60,0x13);
        if (iVar1 == 0) {
          iVar1 = mbedtls_mpi_add_abs(N,N,&local_60);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int ecp_mod_p255( mbedtls_mpi *N )
{
    int ret;
    size_t i;
    mbedtls_mpi M;
    mbedtls_mpi_uint Mp[P255_WIDTH + 2];

    if( N->n < P255_WIDTH )
        return( 0 );

    /* M = A1 */
    M.s = 1;
    M.n = N->n - ( P255_WIDTH - 1 );
    if( M.n > P255_WIDTH + 1 )
        M.n = P255_WIDTH + 1;
    M.p = Mp;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + P255_WIDTH - 1, M.n * sizeof( mbedtls_mpi_uint ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, 255 % ( 8 * sizeof( mbedtls_mpi_uint ) ) ) );
    M.n++; /* Make room for multiplication by 19 */

    /* N = A0 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( N, 255, 0 ) );
    for( i = P255_WIDTH; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + 19 * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M, &M, 19 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

cleanup:
    return( ret );
}